

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O2

int __kmp_api_omp_get_num_teams_(void)

{
  int iVar1;
  kmp_info_t *pkVar2;
  int iVar3;
  kmp_team_p *pkVar4;
  int iVar5;
  int iVar6;
  
  pkVar2 = __kmp_entry_thread();
  iVar1 = 1;
  if ((pkVar2->th).th_teams_microtask != (microtask_t)0x0) {
    pkVar4 = (pkVar2->th).th_team;
    iVar5 = (pkVar4->t).t_level;
    iVar6 = (pkVar4->t).t_serialized;
    iVar3 = (pkVar2->th).th_teams_level + 1;
LAB_0015a4d2:
    if (iVar3 < iVar5) {
      iVar6 = (pkVar4->t).t_serialized;
      for (; (0 < iVar6 && (iVar3 < iVar5)); iVar5 = iVar5 + -1) {
        iVar6 = iVar6 + -1;
      }
      if (iVar6 != 0 || (pkVar4->t).t_serialized == 0) goto code_r0x0015a500;
      goto LAB_0015a506;
    }
    if (iVar6 < 2) {
      iVar1 = (((pkVar4->t).t_parent)->t).t_nproc;
    }
  }
  return iVar1;
code_r0x0015a500:
  if (iVar3 < iVar5) {
    iVar5 = iVar5 + -1;
LAB_0015a506:
    pkVar4 = (pkVar4->t).t_parent;
  }
  goto LAB_0015a4d2;
}

Assistant:

int FTN_STDCALL KMP_EXPAND_NAME(FTN_GET_NUM_TEAMS)(void) {
#ifdef KMP_STUB
  return 1;
#else
  kmp_info_t *thr = __kmp_entry_thread();
  if (thr->th.th_teams_microtask) {
    kmp_team_t *team = thr->th.th_team;
    int tlevel = thr->th.th_teams_level;
    int ii = team->t.t_level; // the level of the teams construct
    int dd = team->t.t_serialized;
    int level = tlevel + 1;
    KMP_DEBUG_ASSERT(ii >= tlevel);
    while (ii > level) {
      for (dd = team->t.t_serialized; (dd > 0) && (ii > level); dd--, ii--) {
      }
      if (team->t.t_serialized && (!dd)) {
        team = team->t.t_parent;
        continue;
      }
      if (ii > level) {
        team = team->t.t_parent;
        ii--;
      }
    }
    if (dd > 1) {
      return 1; // teams region is serialized ( 1 team of 1 thread ).
    } else {
      return team->t.t_parent->t.t_nproc;
    }
  } else {
    return 1;
  }
#endif
}